

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

void __thiscall notch::core::FullyConnectedLayer::calcActivationGrad(FullyConnectedLayer *this)

{
  size_t sVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float extraout_XMM0_Da;
  
  sVar1 = (this->inducedLocalField)._M_size;
  pfVar3 = (this->inducedLocalField)._M_data;
  pfVar4 = pfVar3 + sVar1;
  if (sVar1 == 0) {
    pfVar4 = (float *)0x0;
    pfVar3 = (float *)0x0;
  }
  if (pfVar3 != pfVar4) {
    pfVar2 = (float *)(this->activationGrad)._M_size;
    if (pfVar2 != (float *)0x0) {
      pfVar2 = (this->activationGrad)._M_data;
    }
    do {
      (*this->activationFunction->_vptr_Activation[2])(*pfVar3);
      *pfVar2 = extraout_XMM0_Da;
      pfVar3 = pfVar3 + 1;
      pfVar2 = pfVar2 + 1;
    } while (pfVar3 != pfVar4);
  }
  return;
}

Assistant:

TanhActivation(float a, float b, std::string name = "tanh")
        : a(a), b(b), name(name) {}